

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O0

int ffpr4b(fitsfile *fptr,long nvals,long incre,float *values,int *status)

{
  int *in_RCX;
  long in_RDX;
  int *in_R8;
  void *in_stack_00000028;
  int *in_stack_00000030;
  void *in_stack_00000038;
  LONGLONG in_stack_00000040;
  fitsfile *in_stack_00000048;
  
  ffswap4(in_RCX,(long)in_R8);
  if (in_RDX == 4) {
    ffpbyt(in_stack_00000048,in_stack_00000040,in_stack_00000038,in_stack_00000030);
  }
  else {
    ffpbytoff(in_stack_00000048,in_stack_00000040,(long)in_stack_00000038,(long)in_stack_00000030,
              in_stack_00000028,&fptr->HDUposition);
  }
  return *in_R8;
}

Assistant:

int ffpr4b(fitsfile *fptr, /* I - FITS file pointer                         */
           long nvals,     /* I - number of pixels in the values array      */
           long incre,     /* I - byte increment between pixels             */
           float *values,  /* I - array of values to write                  */
           int *status)    /* IO - error status                             */
/*
  put (write) the array of values to the FITS file, doing machine dependent
  format conversion (e.g. byte-swapping) if necessary.
*/
{
#if MACHINE == VAXVMS
    long ii;

    ii = nvals;                      /* call VAX macro routine to convert */
    ieevpr(values, values, &ii);     /* from F float -> IEEE float        */

#elif (MACHINE == ALPHAVMS) && (FLOATTYPE == GFLOAT)
    long ii;

    /* convert from VMS FFLOAT float format to IEEE float format */
    for (ii = 0; ii < nvals; ii++)
        values[ii] *= 0.25;

    ffswap2( (short *) values, nvals * 2);  /* swap pairs of bytes */

#elif BYTESWAPPED
    ffswap4((INT32BIT *) values, nvals); /* reverse order of bytes in values */
#endif

    if (incre == 4)      /* write all the values at once (contiguous bytes) */

        ffpbyt(fptr, nvals * 4, values, status);

    else         /* have to write each value individually (not contiguous ) */

        ffpbytoff(fptr, 4, nvals, incre - 4, values, status);

    return(*status);
}